

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

uint8_t * __thiscall
BTree<EntryBTree,_EntryKey>::searchWithComparison
          (BTree<EntryBTree,_EntryKey> *this,SearchResult *result,uint8_t *data,uint count,
          EntryKey *key,KeyCompareOp compOp)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  code *pcVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  uint8_t *puVar8;
  uint uVar9;
  uint uVar10;
  code *in_stack_00000008;
  long in_stack_00000010;
  
  plVar7 = (long *)((long)&this->m_data + in_stack_00000010);
  uVar2 = swap_bytes(*(undefined2 *)data);
  uVar10 = uVar2 >> 4 & 0x7ff;
  result->upperBound = uVar10;
  uVar1 = 0;
  uVar9 = 0;
  while( true ) {
    uVar6 = uVar1;
    if (uVar10 < uVar6 || uVar10 - uVar6 == 0) {
      puVar8 = (uint8_t *)0x0;
      result->lowerBound = uVar9;
      result->index = 0xffffffff;
      if ((count != 0) && (uVar9 != result->upperBound)) {
        uVar2 = swap_bytes(*(undefined2 *)(data + (uVar9 * 0xc + 0xc >> 3)));
        puVar8 = data + (uVar2 >> ((byte)(uVar9 << 2) & 4) & 0xfff);
      }
      return puVar8;
    }
    pcVar4 = in_stack_00000008;
    if (((ulong)in_stack_00000008 & 1) != 0) {
      pcVar4 = *(code **)(in_stack_00000008 + *plVar7 + -1);
    }
    uVar5 = uVar10 - uVar6 >> 1;
    uVar1 = uVar5 + 1 + uVar6;
    uVar5 = uVar5 + uVar6;
    uVar2 = swap_bytes(*(undefined2 *)(data + (uVar1 * 0xc >> 3)));
    iVar3 = (*pcVar4)(plVar7,key,data + (uVar2 >> ((char)uVar5 * '\x04' & 4U) & 0xfff));
    if (iVar3 == 0) break;
    uVar9 = uVar1;
    if (iVar3 < 1) {
      uVar10 = uVar5;
      uVar1 = uVar6;
      uVar9 = uVar5;
    }
  }
  result->lowerBound = uVar5;
  result->index = uVar5;
  return data + (uVar2 >> ((char)uVar5 * '\x04' & 4U) & 0xfff);
}

Assistant:

const uint8_t* searchWithComparison(SearchResult& result, const uint8_t* data, unsigned int count, const Key& key, KeyCompareOp compOp) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto high = getBitsAt(data, 0) & UINT32_C(0x7FF), low = 0u;
		auto index = 0u;
		const uint8_t* subData;
		
		result.upperBound = high;

		while (low < high) {
			const auto mid = low + (high - low) / 2;
			index = mid + 1;

			const auto offset = getBitsAt(data, index);
			subData = advancePointer(data, offset);

			const auto ret = (self.*compOp)(key, subData);
			if (ret == 0) {
				result.lowerBound = mid;
				result.index = mid;
				goto done;
			} else if (ret > 0) {
				low = index;
			} else if (ret < 0) {
				high = mid;
				index = mid;
			}
		}
		
		subData = nullptr;

		result.lowerBound = index;
		result.index = INVALID_INDEX;
		
		if (count != 0 && index != result.upperBound) {
			const auto offset = getBitsAt(data, index + 1);
			subData = advancePointer(data, offset);
		}
		
	done:
		return subData;
	}